

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getPosFloatOrInf(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  char *__s1;
  int iVar1;
  ostream *poVar2;
  invalid_argument *piVar3;
  Attribute *pAVar4;
  double dVar5;
  allocator<char> local_1d5;
  float f;
  string local_1d0 [32];
  stringstream e;
  ostream local_1a0 [16];
  int local_190;
  Attribute *local_188;
  
  if (argc + -2 < *i) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Expected a positive float (or \"infinity\")");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __s1 = argv[(long)*i + 1];
  iVar1 = strcmp(__s1,"inf");
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"infinity");
    if (iVar1 != 0) {
      dVar5 = strtod(__s1,(char **)0x0);
      f = (float)dVar5;
      if (f <= 0.0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&e);
        poVar2 = std::operator<<(local_1a0,"The value for the ");
        poVar2 = std::operator<<(poVar2,attrName);
        std::operator<<(poVar2," attribute must be greater than zero, or \"infinity\"");
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar3,local_1d0);
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      goto LAB_00103dc2;
    }
  }
  f = *(float *)(_imath_half_to_float_table + 0x1f000);
LAB_00103dc2:
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,attrName,&local_1d5);
  pAVar4 = (Attribute *)operator_new(0x10);
  Imf_3_4::TypedAttribute<float>::TypedAttribute((float *)pAVar4);
  std::__cxx11::string::string((string *)&e,local_1d0);
  local_190 = part;
  local_188 = pAVar4;
  std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,(SetAttr *)&e);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string(local_1d0);
  *i = *i + 2;
  return;
}

Assistant:

void
getPosFloatOrInf (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 2)
        throw invalid_argument ("Expected a positive float (or \"infinity\")");

    float f;

    if (!strcmp (argv[i + 1], "inf") || !strcmp (argv[i + 1], "infinity"))
    {
        f = float (half::posInf ());
    }
    else
    {
        f = static_cast<float> (strtod (argv[i + 1], 0));

        if (f <= 0)
        {
            std::stringstream e;
            e << "The value for the " << attrName
              << " attribute must be greater than zero, or \"infinity\"";
            throw invalid_argument (e.str ());
        }
    }

    attrs.push_back (SetAttr (attrName, part, new FloatAttribute (f)));
    i += 2;
}